

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Vec3<int>_>::readValueFrom
          (TypedAttribute<Imath_3_2::Vec3<int>_> *this,IStream *is,int size,int version)

{
  IStream *in_RDI;
  int *in_stack_ffffffffffffffd8;
  
  Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(in_RDI,in_stack_ffffffffffffffd8);
  Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(in_RDI,in_stack_ffffffffffffffd8);
  Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

IMF_EXPORT void
V3iAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    Xdr::read<StreamIO> (is, _value.x);
    Xdr::read<StreamIO> (is, _value.y);
    Xdr::read<StreamIO> (is, _value.z);
}